

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_line_splitter.cpp
# Opt level: O0

void __thiscall
LineSplitter_TwoStringsSingleAppend_Test::~LineSplitter_TwoStringsSingleAppend_Test
          (LineSplitter_TwoStringsSingleAppend_Test *this)

{
  LineSplitter_TwoStringsSingleAppend_Test *this_local;
  
  ~LineSplitter_TwoStringsSingleAppend_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (LineSplitter, TwoStringsSingleAppend) {
    using namespace pstore::dump;

    array::container container;
    line_splitter ls (&container);
    ls.append ("hello\nthere\n"s);

    array arr (std::move (container));
    std::ostringstream out;
    arr.write (out);
    EXPECT_EQ (out.str (), "\n- hello\n- there");
}